

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O2

double __thiscall
HighsSearch::checkSol
          (HighsSearch *this,vector<double,_std::allocator<double>_> *sol,bool *integerfeasible)

{
  double *pdVar1;
  uint uVar2;
  HighsMipSolver *pHVar3;
  HighsLp *pHVar4;
  pointer pdVar5;
  bool bVar6;
  HighsInt i;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  *integerfeasible = true;
  pHVar3 = this->mipsolver;
  pHVar4 = pHVar3->model_;
  uVar2 = pHVar4->num_col_;
  pdVar5 = (sol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar10 = 0.0;
  bVar6 = true;
  dVar11 = 0.0;
  for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
    dVar9 = pdVar5[uVar7];
    dVar12 = (pHVar4->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7] * dVar9;
    if ((bVar6) &&
       ((pHVar4->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar7] == kInteger)) {
      dVar8 = round(dVar9);
      pdVar1 = &((pHVar3->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
      if (*pdVar1 <= ABS(dVar9 - dVar8) && ABS(dVar9 - dVar8) != *pdVar1) {
        *integerfeasible = false;
        bVar6 = false;
      }
    }
    dVar9 = dVar11 + dVar12;
    dVar10 = dVar10 + (dVar11 - (dVar9 - dVar12)) + (dVar12 - (dVar9 - (dVar9 - dVar12)));
    dVar11 = dVar9;
  }
  return dVar10 + dVar11;
}

Assistant:

double HighsSearch::checkSol(const std::vector<double>& sol,
                             bool& integerfeasible) const {
  HighsCDouble objval = 0.0;
  integerfeasible = true;
  for (HighsInt i = 0; i != mipsolver.numCol(); ++i) {
    objval += sol[i] * mipsolver.colCost(i);
    assert(std::isfinite(sol[i]));

    if (!integerfeasible || mipsolver.variableType(i) != HighsVarType::kInteger)
      continue;

    if (fractionality(sol[i]) > mipsolver.mipdata_->feastol) {
      integerfeasible = false;
    }
  }

  return double(objval);
}